

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O2

int VectorMismatch_SSE2(uint32_t *array1,uint32_t *array2,int length)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  iVar1 = 0;
  iVar2 = 0;
  puVar5 = array2;
  puVar6 = array1;
  iVar4 = length;
  if (length < 0xc) {
    if ((3 < length) &&
       (auVar10._0_4_ = -(uint)(*array2 == *array1), auVar10._4_4_ = -(uint)(array2[1] == array1[1])
       , auVar10._8_4_ = -(uint)(array2[2] == array1[2]),
       auVar10._12_4_ = -(uint)(array2[3] == array1[3]), iVar4 = movmskps(length,auVar10),
       iVar4 == 0xf)) {
      if ((uint)length < 8) {
        iVar2 = 4;
      }
      else {
        auVar11._0_4_ = -(uint)(array2[4] == array1[4]);
        auVar11._4_4_ = -(uint)(array2[5] == array1[5]);
        auVar11._8_4_ = -(uint)(array2[6] == array1[6]);
        auVar11._12_4_ = -(uint)(array2[7] == array1[7]);
        iVar4 = movmskps(0,auVar11);
        iVar2 = (uint)(iVar4 == 0xf) * 4 + 4;
      }
    }
  }
  else {
    do {
      auVar8._0_4_ = -(uint)(*puVar5 == *puVar6);
      auVar8._4_4_ = -(uint)(puVar5[1] == puVar6[1]);
      auVar8._8_4_ = -(uint)(puVar5[2] == puVar6[2]);
      auVar8._12_4_ = -(uint)(puVar5[3] == puVar6[3]);
      iVar4 = movmskps(iVar4,auVar8);
      iVar2 = iVar1;
      if (iVar4 != 0xf) break;
      puVar5 = array2 + (long)iVar1 + 4;
      puVar6 = array1 + (long)iVar1 + 4;
      auVar9._0_4_ = -(uint)(*puVar6 == *puVar5);
      auVar9._4_4_ = -(uint)(puVar6[1] == puVar5[1]);
      auVar9._8_4_ = -(uint)(puVar6[2] == puVar5[2]);
      auVar9._12_4_ = -(uint)(puVar6[3] == puVar5[3]);
      bVar7 = (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                       (ushort)((byte)(auVar9._12_4_ >> 7) & 1) << 0xc |
                       (ushort)((byte)(auVar9._12_4_ >> 0xf) & 1) << 0xd |
                       (ushort)((byte)(auVar9._12_4_ >> 0x17) & 1) << 0xe |
                      (ushort)(byte)(auVar9._12_4_ >> 0x1f) << 0xf) == 0xffff;
      iVar2 = iVar1 + 4 + (uint)bVar7 * 4;
      if (!bVar7) break;
      iVar4 = iVar1 + (uint)bVar7 * 4 + 0x10;
      puVar5 = array2 + (long)iVar1 + 8;
      puVar6 = array1 + (long)iVar1 + 8;
      iVar1 = iVar2;
    } while (iVar4 < length);
  }
  lVar3 = (long)iVar2;
  iVar4 = length;
  if (length < iVar2) {
    iVar4 = iVar2;
  }
  while( true ) {
    if (length <= lVar3) {
      return iVar4;
    }
    if (array1[lVar3] != array2[lVar3]) break;
    lVar3 = lVar3 + 1;
  }
  return (int)lVar3;
}

Assistant:

static int VectorMismatch_SSE2(const uint32_t* const array1,
                               const uint32_t* const array2, int length) {
  int match_len;

  if (length >= 12) {
    __m128i A0 = _mm_loadu_si128((const __m128i*)&array1[0]);
    __m128i A1 = _mm_loadu_si128((const __m128i*)&array2[0]);
    match_len = 0;
    do {
      // Loop unrolling and early load both provide a speedup of 10% for the
      // current function. Also, max_limit can be MAX_LENGTH=4096 at most.
      const __m128i cmpA = _mm_cmpeq_epi32(A0, A1);
      const __m128i B0 =
          _mm_loadu_si128((const __m128i*)&array1[match_len + 4]);
      const __m128i B1 =
          _mm_loadu_si128((const __m128i*)&array2[match_len + 4]);
      if (_mm_movemask_epi8(cmpA) != 0xffff) break;
      match_len += 4;

      {
        const __m128i cmpB = _mm_cmpeq_epi32(B0, B1);
        A0 = _mm_loadu_si128((const __m128i*)&array1[match_len + 4]);
        A1 = _mm_loadu_si128((const __m128i*)&array2[match_len + 4]);
        if (_mm_movemask_epi8(cmpB) != 0xffff) break;
        match_len += 4;
      }
    } while (match_len + 12 < length);
  } else {
    match_len = 0;
    // Unroll the potential first two loops.
    if (length >= 4 &&
        _mm_movemask_epi8(_mm_cmpeq_epi32(
            _mm_loadu_si128((const __m128i*)&array1[0]),
            _mm_loadu_si128((const __m128i*)&array2[0]))) == 0xffff) {
      match_len = 4;
      if (length >= 8 &&
          _mm_movemask_epi8(_mm_cmpeq_epi32(
              _mm_loadu_si128((const __m128i*)&array1[4]),
              _mm_loadu_si128((const __m128i*)&array2[4]))) == 0xffff) {
        match_len = 8;
      }
    }
  }

  while (match_len < length && array1[match_len] == array2[match_len]) {
    ++match_len;
  }
  return match_len;
}